

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuCreate.c
# Opt level: O3

Fxu_Matrix * Fxu_CreateMatrix(Fxu_Data_t *pData)

{
  char *pcVar1;
  int iVar2;
  void *pvVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  Fxu_Matrix *p;
  Fxu_Var **ppFVar10;
  Fxu_Var *pFVar11;
  Fxu_Pair ***pppFVar12;
  Fxu_Pair **__s;
  int *__base;
  Fxu_Cube *pFVar13;
  long lVar14;
  long lVar15;
  uint uVar16;
  ulong uVar17;
  Fxu_Cube *pCube1;
  uint nPairsTotal;
  char *pcVar18;
  uint uVar19;
  uint uVar20;
  int i;
  long lVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  int iVar24;
  
  iVar6 = pData->nNodesOld;
  if (0 < iVar6) {
    uVar9 = 0xffffffff;
    lVar21 = 0;
    uVar16 = 0;
    nPairsTotal = 0;
    uVar19 = 0;
    do {
      pcVar18 = (char *)pData->vSops->pArray[lVar21];
      if (pcVar18 != (char *)0x0) {
        iVar6 = Abc_SopGetCubeNum(pcVar18);
        uVar7 = Abc_SopGetVarNum(pcVar18);
        if (((int)uVar7 < 2) || (iVar6 < 1)) {
          __assert_fail("nFanins > 1 && nCubes > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fxu/fxuCreate.c"
                        ,0x50,"Fxu_Matrix *Fxu_CreateMatrix(Fxu_Data_t *)");
        }
        uVar19 = uVar19 + iVar6;
        nPairsTotal = nPairsTotal + ((uint)((iVar6 + -1) * iVar6) >> 1);
        uVar16 = iVar6 * iVar6 + uVar16;
        if ((int)uVar9 <= (int)uVar7) {
          uVar9 = uVar7;
        }
        iVar6 = pData->nNodesOld;
      }
      lVar21 = lVar21 + 1;
    } while (lVar21 < iVar6);
    if (0 < (int)uVar9) {
      if (50000000 < (int)uVar16) {
        printf("The problem is too large to be solved by \"fxu\" (%d cubes and %d cube pairs)\n",
               uVar19);
        return (Fxu_Matrix *)0x0;
      }
      p = Fxu_MatrixAllocate();
      uVar17 = (ulong)pData->nNodesOld;
      ppFVar10 = (Fxu_Var **)malloc(((long)pData->nNodesExt + uVar17) * 0x10);
      p->ppVars = ppFVar10;
      if (0 < (long)uVar17) {
        lVar21 = 0;
        do {
          pFVar11 = Fxu_MatrixAddVar(p);
          p->ppVars[lVar21] = pFVar11;
          lVar21 = lVar21 + 1;
          uVar17 = (ulong)pData->nNodesOld;
        } while (SBORROW8(lVar21,uVar17 * 2) != (long)(lVar21 + uVar17 * -2) < 0);
      }
      pppFVar12 = (Fxu_Pair ***)malloc((ulong)uVar19 * 8 + 800);
      p->pppPairs = pppFVar12;
      __s = (Fxu_Pair **)malloc((ulong)uVar16 * 8 + 800);
      p->ppPairs = __s;
      memset(__s,0,(ulong)uVar16 * 8);
      if ((int)uVar17 < 1) {
        bVar4 = false;
        uVar20 = 0;
        uVar7 = 0;
      }
      else {
        lVar21 = 0;
        uVar20 = 0;
        uVar7 = 0;
        do {
          pcVar18 = (char *)pData->vSops->pArray[lVar21];
          if (pcVar18 != (char *)0x0) {
            uVar8 = Abc_SopGetCubeNum(pcVar18);
            pFVar11 = p->ppVars[lVar21 * 2 + 1];
            pFVar11->nCubes = uVar8;
            if (0 < (int)uVar8) {
              pppFVar12 = p->pppPairs;
              pFVar11->ppPairs = pppFVar12 + (int)uVar7;
              pppFVar12[(int)uVar7] = p->ppPairs + (int)uVar20;
              if (uVar8 != 1) {
                uVar17 = 1;
                do {
                  pFVar11->ppPairs[uVar17] = pFVar11->ppPairs[uVar17 - 1] + uVar8;
                  uVar17 = uVar17 + 1;
                } while (uVar8 != uVar17);
              }
            }
            uVar7 = uVar7 + uVar8;
            uVar20 = uVar20 + uVar8 * uVar8;
            uVar17 = (ulong)(uint)pData->nNodesOld;
          }
          lVar21 = lVar21 + 1;
        } while (lVar21 < (int)uVar17);
        bVar4 = 0 < (int)uVar17;
      }
      if (uVar7 != uVar19) {
        __assert_fail("iCube == nCubesTotal",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fxu/fxuCreate.c"
                      ,0x85,"Fxu_Matrix *Fxu_CreateMatrix(Fxu_Data_t *)");
      }
      if (uVar20 != uVar16) {
        __assert_fail("iPair == nPairsStore",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fxu/fxuCreate.c"
                      ,0x86,"Fxu_Matrix *Fxu_CreateMatrix(Fxu_Data_t *)");
      }
      __base = (int *)malloc((ulong)uVar9 << 2);
      if (bVar4) {
        lVar21 = 0;
        do {
          pcVar18 = (char *)pData->vSops->pArray[lVar21];
          if (pcVar18 != (char *)0x0) {
            pFVar11 = p->ppVars[lVar21 * 2 + 1];
            pvVar3 = pData->vFanins->pArray[lVar21];
            s_pLits = *(int **)((long)pvVar3 + 8);
            uVar9 = Abc_SopGetVarNum(pcVar18);
            auVar5 = _DAT_008403e0;
            if (0 < (int)uVar9) {
              lVar15 = (ulong)uVar9 - 1;
              auVar22._8_4_ = (int)lVar15;
              auVar22._0_8_ = lVar15;
              auVar22._12_4_ = (int)((ulong)lVar15 >> 0x20);
              auVar22 = auVar22 ^ _DAT_008403e0;
              uVar17 = 0;
              auVar23 = _DAT_008403d0;
              do {
                bVar4 = auVar22._0_4_ < SUB164(auVar23 ^ auVar5,0);
                iVar6 = auVar22._4_4_;
                iVar24 = SUB164(auVar23 ^ auVar5,4);
                if ((bool)(~(iVar6 < iVar24 || iVar24 == iVar6 && bVar4) & 1)) {
                  __base[uVar17] = (int)uVar17;
                }
                if (iVar6 >= iVar24 && (iVar24 != iVar6 || !bVar4)) {
                  __base[uVar17 + 1] = (int)uVar17 + 1;
                }
                uVar17 = uVar17 + 2;
                lVar15 = auVar23._8_8_;
                auVar23._0_8_ = auVar23._0_8_ + 2;
                auVar23._8_8_ = lVar15 + 2;
              } while ((uVar9 + 1 & 0xfffffffe) != uVar17);
            }
            qsort(__base,(long)(int)uVar9,4,Fxu_CreateMatrixLitCompare);
            if (s_pLits[__base[(long)(int)uVar9 - 1]] <= s_pLits[*__base]) {
              __assert_fail("s_pLits[ pOrder[0] ] < s_pLits[ pOrder[nFanins-1] ]",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fxu/fxuCreate.c"
                            ,0x9c,"Fxu_Matrix *Fxu_CreateMatrix(Fxu_Data_t *)");
            }
            if (*pcVar18 == '\0') {
              pFVar11->pFirst = (Fxu_Cube *)0x0;
            }
            else {
              pCube1 = (Fxu_Cube *)0x0;
              iVar6 = 0;
              do {
                pFVar13 = Fxu_MatrixAddCube(p,pFVar11,iVar6);
                for (lVar15 = 0; (pcVar18[lVar15] & 0xdfU) != 0; lVar15 = lVar15 + 1) {
                  lVar14 = (long)__base[lVar15];
                  if (pcVar18[lVar14] == '1') {
                    iVar24 = *(int *)(*(long *)((long)pvVar3 + 8) + lVar14 * 4) * 2;
LAB_00458908:
                    Fxu_MatrixAddLiteral(p,pFVar13,p->ppVars[iVar24]);
                  }
                  else if (pcVar18[lVar14] == '0') {
                    iVar24 = *(int *)(*(long *)((long)pvVar3 + 8) + lVar14 * 4) * 2 + 1;
                    goto LAB_00458908;
                  }
                }
                if (pCube1 == (Fxu_Cube *)0x0) {
                  pCube1 = pFVar13;
                }
                pFVar13->pFirst = pCube1;
                pcVar1 = pcVar18 + (int)(uVar9 + 3);
                pcVar18 = pcVar18 + (int)(uVar9 + 3);
                iVar6 = iVar6 + 1;
              } while (*pcVar1 != '\0');
              pFVar11->pFirst = pCube1;
              if ((int)nPairsTotal <= pData->nPairsMax) {
                for (; (pCube1 != (Fxu_Cube *)0x0 &&
                       (pFVar13 = pCube1->pNext, pFVar13 != (Fxu_Cube *)0x0));
                    pCube1 = pCube1->pNext) {
                  do {
                    Fxu_MatrixAddDivisor(p,pCube1,pFVar13);
                    pFVar13 = pFVar13->pNext;
                  } while (pFVar13 != (Fxu_Cube *)0x0);
                }
              }
            }
          }
          lVar21 = lVar21 + 1;
        } while (lVar21 < pData->nNodesOld);
      }
      if (__base != (int *)0x0) {
        free(__base);
      }
      if ((int)nPairsTotal < 0x989681) {
        if ((pData->nPairsMax < (int)nPairsTotal) &&
           (iVar6 = Fxu_PreprocessCubePairs(p,pData->vSops,nPairsTotal,pData->nPairsMax), iVar6 == 0
           )) {
          return (Fxu_Matrix *)0x0;
        }
        if ((p->lVars).nItems < 0xf4241) {
          Fxu_MatrixComputeSingles(p,pData->fUse0,pData->nSingleMax);
          if (pData->fVerbose != 0) {
            iVar6 = p->nEntries;
            iVar24 = (p->lCubes).nItems;
            iVar2 = (p->lVars).nItems;
            fprintf(_stdout,"Matrix: [vars x cubes] = [%d x %d]  ");
            fprintf(_stdout,"Lits = %d  Density = %.5f%%\n",
                    ((double)iVar6 / (double)iVar2) / (double)iVar24,(ulong)(uint)p->nEntries);
            fprintf(_stdout,"1-cube divs = %6d. (Total = %6d)  ",(ulong)(uint)(p->lSingles).nItems,
                    (ulong)(uint)p->nSingleTotal);
            fprintf(_stdout,"2-cube divs = %6d. (Total = %6d)",(ulong)(uint)p->nDivsTotal,
                    (ulong)nPairsTotal);
            fputc(10,_stdout);
            return p;
          }
          return p;
        }
        pcVar18 = "The total number of variables is more than 1,000,000.";
      }
      else {
        pcVar18 = "The total number of cube pairs of the network is more than 10,000,000.";
      }
      puts(pcVar18);
      puts("Command \"fx\" takes a long time to run in such cases. It is suggested");
      puts("that the user changes the network by reducing the size of logic node and");
      puts("consequently the number of cube pairs to be processed by this command.");
      puts("It can be achieved as follows: \"st; if -K <num>\" or \"st; renode -s -K <num>\"");
      pcVar18 = "as a proprocessing step, while selecting <num> as approapriate.";
      goto LAB_004585d5;
    }
  }
  pcVar18 = "The current network does not have SOPs to perform extraction.";
LAB_004585d5:
  puts(pcVar18);
  return (Fxu_Matrix *)0x0;
}

Assistant:

Fxu_Matrix * Fxu_CreateMatrix( Fxu_Data_t * pData )
{
    Fxu_Matrix * p;
    Fxu_Var * pVar;
    Fxu_Cube * pCubeFirst, * pCubeNew;
    Fxu_Cube * pCube1, * pCube2;
    Vec_Int_t * vFanins;
    char * pSopCover;
    char * pSopCube;
    int * pOrder, nBitsMax;
    int i, v, c;
    int nCubesTotal;
    int nPairsTotal;
    int nPairsStore;
    int nCubes;
    int iCube, iPair;
    int nFanins;

    // collect all sorts of statistics
    nCubesTotal =  0;
    nPairsTotal =  0;
    nPairsStore =  0;
    nBitsMax    = -1; 
    for ( i = 0; i < pData->nNodesOld; i++ )
        if ( (pSopCover = (char *)pData->vSops->pArray[i]) )
        {
            nCubes       = Abc_SopGetCubeNum( pSopCover );
            nFanins      = Abc_SopGetVarNum( pSopCover );
            assert( nFanins > 1 && nCubes > 0 );

            nCubesTotal += nCubes;
            nPairsTotal += nCubes * (nCubes - 1) / 2;
            nPairsStore += nCubes * nCubes;
            if ( nBitsMax < nFanins )
                nBitsMax = nFanins;
        }
    if ( nBitsMax <= 0 )
    {
        printf( "The current network does not have SOPs to perform extraction.\n" );
        return NULL;
    }

    if ( nPairsStore > 50000000 )
    {
        printf( "The problem is too large to be solved by \"fxu\" (%d cubes and %d cube pairs)\n", nCubesTotal, nPairsStore );
        return NULL;
    }

    // start the matrix
	p = Fxu_MatrixAllocate();
    // create the column labels 
    p->ppVars = ABC_ALLOC( Fxu_Var *, 2 * (pData->nNodesOld + pData->nNodesExt) );
    for ( i = 0; i < 2 * pData->nNodesOld; i++ )
        p->ppVars[i] = Fxu_MatrixAddVar( p );

    // allocate storage for all cube pairs at once
    p->pppPairs = ABC_ALLOC( Fxu_Pair **, nCubesTotal + 100 );
    p->ppPairs  = ABC_ALLOC( Fxu_Pair *,  nPairsStore + 100 );
    memset( p->ppPairs, 0, sizeof(Fxu_Pair *) * nPairsStore );
    iCube = 0;
    iPair = 0;
    for ( i = 0; i < pData->nNodesOld; i++ )
        if ( (pSopCover = (char *)pData->vSops->pArray[i]) )
        {
            // get the number of cubes
            nCubes = Abc_SopGetCubeNum( pSopCover );
            // get the new var in the matrix
            pVar = p->ppVars[2*i+1];
            // assign the pair storage
            pVar->nCubes     = nCubes;
            if ( nCubes > 0 )
            {
                pVar->ppPairs    = p->pppPairs + iCube;
                pVar->ppPairs[0] = p->ppPairs  + iPair;
                for ( v = 1; v < nCubes; v++ )
                    pVar->ppPairs[v] = pVar->ppPairs[v-1] + nCubes;
            }
            // update
            iCube += nCubes;
            iPair += nCubes * nCubes;
        }
    assert( iCube == nCubesTotal );
    assert( iPair == nPairsStore );


    // allocate room for the reordered literals
    pOrder = ABC_ALLOC( int, nBitsMax );
    // create the rows
    for ( i = 0; i < pData->nNodesOld; i++ )
    if ( (pSopCover = (char *)pData->vSops->pArray[i]) )
    {
        // get the new var in the matrix
        pVar = p->ppVars[2*i+1];
        // here we sort the literals of the cover
        // in the increasing order of the numbers of the corresponding nodes
        // because literals should be added to the matrix in this order
        vFanins = (Vec_Int_t *)pData->vFanins->pArray[i];
        s_pLits = vFanins->pArray;
        // start the variable order
        nFanins = Abc_SopGetVarNum( pSopCover );
        for ( v = 0; v < nFanins; v++ )
            pOrder[v] = v;
        // reorder the fanins
        qsort( (void *)pOrder, nFanins, sizeof(int),(int (*)(const void *, const void *))Fxu_CreateMatrixLitCompare);
        assert( s_pLits[ pOrder[0] ] < s_pLits[ pOrder[nFanins-1] ] );
        // create the corresponding cubes in the matrix
        pCubeFirst = NULL;
        c = 0;
        Abc_SopForEachCube( pSopCover, nFanins, pSopCube )
        {
            // create the cube
	        pCubeNew = Fxu_MatrixAddCube( p, pVar, c++ );
            Fxu_CreateMatrixAddCube( p, pCubeNew, pSopCube, vFanins, pOrder );
            if ( pCubeFirst == NULL )
                pCubeFirst = pCubeNew;
            pCubeNew->pFirst = pCubeFirst;
        }
        // set the first cube of this var
        pVar->pFirst = pCubeFirst;
        // create the divisors without preprocessing
        if ( nPairsTotal <= pData->nPairsMax )
        {
		    for ( pCube1 = pCubeFirst; pCube1; pCube1 = pCube1->pNext )
			    for ( pCube2 = pCube1? pCube1->pNext: NULL; pCube2; pCube2 = pCube2->pNext )
				    Fxu_MatrixAddDivisor( p, pCube1, pCube2 );
        }
    }
    ABC_FREE( pOrder );

    // consider the case when cube pairs should be preprocessed
    // before adding them to the set of divisors
//    if ( pData->fVerbose )
//        printf( "The total number of cube pairs is %d.\n", nPairsTotal );
    if ( nPairsTotal > 10000000 )
    {
        printf( "The total number of cube pairs of the network is more than 10,000,000.\n" );
        printf( "Command \"fx\" takes a long time to run in such cases. It is suggested\n" );
        printf( "that the user changes the network by reducing the size of logic node and\n" );
        printf( "consequently the number of cube pairs to be processed by this command.\n" );
        printf( "It can be achieved as follows: \"st; if -K <num>\" or \"st; renode -s -K <num>\"\n" );
        printf( "as a proprocessing step, while selecting <num> as approapriate.\n" );
        return NULL;
    }
    if ( nPairsTotal > pData->nPairsMax )
        if ( !Fxu_PreprocessCubePairs( p, pData->vSops, nPairsTotal, pData->nPairsMax ) )
            return NULL;
//    if ( pData->fVerbose )
//        printf( "Only %d best cube pairs will be used by the fast extract command.\n", pData->nPairsMax );

    if ( p->lVars.nItems > 1000000 )
    {
        printf( "The total number of variables is more than 1,000,000.\n" );
        printf( "Command \"fx\" takes a long time to run in such cases. It is suggested\n" );
        printf( "that the user changes the network by reducing the size of logic node and\n" );
        printf( "consequently the number of cube pairs to be processed by this command.\n" );
        printf( "It can be achieved as follows: \"st; if -K <num>\" or \"st; renode -s -K <num>\"\n" );
        printf( "as a proprocessing step, while selecting <num> as approapriate.\n" );
        return NULL;
    }


    // add the var pairs to the heap
    Fxu_MatrixComputeSingles( p, pData->fUse0, pData->nSingleMax );

    // print stats
    if ( pData->fVerbose )
    {
        double Density;
        Density = ((double)p->nEntries) / p->lVars.nItems / p->lCubes.nItems;
	    fprintf( stdout, "Matrix: [vars x cubes] = [%d x %d]  ",
            p->lVars.nItems, p->lCubes.nItems );
	    fprintf( stdout, "Lits = %d  Density = %.5f%%\n", 
            p->nEntries, Density );
	    fprintf( stdout, "1-cube divs = %6d. (Total = %6d)  ",  p->lSingles.nItems, p->nSingleTotal );
	    fprintf( stdout, "2-cube divs = %6d. (Total = %6d)",  p->nDivsTotal, nPairsTotal );
	    fprintf( stdout, "\n" );
    }
//    Fxu_MatrixPrint( stdout, p );
    return p;
}